

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O2

void g_ptr_array_maybe_expand(GRealPtrArray *array,guint len)

{
  gpointer *ppvVar1;
  guint gVar2;
  ulong uVar3;
  
  gVar2 = len + array->len;
  if (array->alloc < gVar2) {
    gVar2 = g_nearest_pow(gVar2);
    uVar3 = 0x10;
    if (0x10 < gVar2) {
      uVar3 = (ulong)gVar2;
    }
    array->alloc = (guint)uVar3;
    ppvVar1 = (gpointer *)g_realloc(array->pdata,uVar3 << 3);
    array->pdata = ppvVar1;
  }
  return;
}

Assistant:

static void g_ptr_array_maybe_expand (GRealPtrArray *array, guint len)
{
    /* Detect potential overflow */
    //if ((G_MAXUINT - array->len) < len)
    //  g_error ("adding %u to array would overflow", len);

    if ((array->len + len) > array->alloc)
    {
        guint old_alloc = array->alloc;
        array->alloc = g_nearest_pow (array->len + len);
        array->alloc = MAX (array->alloc, MIN_ARRAY_SIZE);
        array->pdata = g_realloc (array->pdata, sizeof (gpointer) * array->alloc);
        if (g_mem_gc_friendly)
            for ( ; old_alloc < array->alloc; old_alloc++)
                array->pdata [old_alloc] = NULL;
    }
}